

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIndexedParticles.cpp
# Opt level: O3

ChFrame<double> * __thiscall
chrono::ChIndexedParticles::GetVisualModelFrame
          (ChFrame<double> *__return_storage_ptr__,ChIndexedParticles *this,uint nclone)

{
  int iVar1;
  undefined4 extraout_var;
  ChQuaternion<double> local_38;
  
  local_38.m_data[0] = 1.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 0.0;
  __return_storage_ptr__->_vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  (__return_storage_ptr__->coord).pos.m_data[0] = 0.0;
  (__return_storage_ptr__->coord).pos.m_data[1] = 0.0;
  (__return_storage_ptr__->coord).pos.m_data[2] = 0.0;
  (__return_storage_ptr__->coord).rot.m_data[0] = 1.0;
  (__return_storage_ptr__->coord).rot.m_data[1] = 0.0;
  (__return_storage_ptr__->coord).rot.m_data[2] = 0.0;
  (__return_storage_ptr__->coord).rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&__return_storage_ptr__->Amatrix,&local_38);
  iVar1 = (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3d])(this,(ulong)nclone);
  ChFrame<double>::operator=(__return_storage_ptr__,(ChFrame<double> *)CONCAT44(extraout_var,iVar1))
  ;
  return __return_storage_ptr__;
}

Assistant:

ChFrame<> ChIndexedParticles::GetVisualModelFrame(unsigned int nclone) {
    ChFrame<> res;
    res = GetParticle(nclone);
    return res;
}